

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

Ptr equalExpress(TokenReader *tokens)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar1;
  element_type *peVar2;
  invalid_argument *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar3;
  int local_dc;
  shared_ptr<SimpleASTNode> local_d8;
  shared_ptr<SimpleASTNode> local_c8;
  undefined4 local_b4;
  shared_ptr<SimpleASTNode> local_b0;
  undefined1 local_a0 [8];
  Ptr child2;
  undefined1 local_58 [8];
  Token token;
  undefined1 local_28 [8];
  Ptr child1;
  TokenReader *tokens_local;
  Ptr *node;
  
  relExpress((TokenReader *)local_28);
  token._39_1_ = 0;
  std::shared_ptr<SimpleASTNode>::shared_ptr
            ((shared_ptr<SimpleASTNode> *)tokens,(shared_ptr<SimpleASTNode> *)local_28);
  do {
    TokenReader::peek();
    bVar1 = std::operator!=((shared_ptr<SimpleASTNode> *)tokens,(nullptr_t)0x0);
    if (((!bVar1) || (bVar1 = Token::isEmpty((Token *)local_58), bVar1)) ||
       ((local_58._0_4_ != EQUAL_TYPE && (local_58._0_4_ != NEQUAL_TYPE)))) {
      local_dc = 3;
    }
    else {
      TokenReader::read();
      this = &child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      Token::operator=((Token *)local_58,(Token *)this);
      Token::~Token((Token *)this);
      relExpress((TokenReader *)local_a0);
      local_b4 = 8;
      SimpleASTNode::create((ASTNodeType *)&local_b0,(string *)&local_b4);
      std::shared_ptr<SimpleASTNode>::operator=((shared_ptr<SimpleASTNode> *)tokens,&local_b0);
      std::shared_ptr<SimpleASTNode>::~shared_ptr(&local_b0);
      peVar2 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)tokens);
      std::shared_ptr<SimpleASTNode>::shared_ptr(&local_c8,(shared_ptr<SimpleASTNode> *)local_28);
      SimpleASTNode::addChild(peVar2,&local_c8);
      std::shared_ptr<SimpleASTNode>::~shared_ptr(&local_c8);
      bVar1 = std::operator!=((shared_ptr<SimpleASTNode> *)local_a0,(nullptr_t)0x0);
      if (!bVar1) {
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_00,"\"==\" Light argument is required!");
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      peVar2 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)tokens);
      std::shared_ptr<SimpleASTNode>::shared_ptr(&local_d8,(shared_ptr<SimpleASTNode> *)local_a0);
      SimpleASTNode::addChild(peVar2,&local_d8);
      std::shared_ptr<SimpleASTNode>::~shared_ptr(&local_d8);
      std::shared_ptr<SimpleASTNode>::operator=
                ((shared_ptr<SimpleASTNode> *)local_28,(shared_ptr<SimpleASTNode> *)tokens);
      std::shared_ptr<SimpleASTNode>::~shared_ptr((shared_ptr<SimpleASTNode> *)local_a0);
      local_dc = 0;
    }
    Token::~Token((Token *)local_58);
  } while (local_dc == 0);
  token._39_1_ = 1;
  std::shared_ptr<SimpleASTNode>::~shared_ptr((shared_ptr<SimpleASTNode> *)local_28);
  PVar3.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)tokens;
  return (Ptr)PVar3.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static SimpleASTNode::Ptr equalExpress(TokenReader& tokens)
{
    SimpleASTNode::Ptr child1 = relExpress(tokens);
    SimpleASTNode::Ptr node = child1;
    while (true) {
        Token token = tokens.peek();
        if (node != nullptr && !token.isEmpty() && (token.type == TokenType::EQUAL_TYPE || token.type == TokenType::NEQUAL_TYPE)) {
            token = tokens.read();
            SimpleASTNode::Ptr child2 = relExpress(tokens);
            node = SimpleASTNode::create(ASTNodeType::EQUAL_EXP, token.val);
            node->addChild(child1);
            if (child2 != nullptr)
                node->addChild(child2);
            else
            {
                throw std::invalid_argument("\"==\" Light argument is required!");
            }
            child1 = node; //key step.
        } else {
            break;
        }
    }
    return node;
}